

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::ConsoleReporter::AssertionPrinter::printReconstructedExpression(AssertionPrinter *this)

{
  ostream *_stream;
  pointer pcVar1;
  bool bVar2;
  Colour colourGuard;
  Colour local_a9;
  string local_a8;
  Text local_88;
  TextAttributes local_30;
  
  bVar2 = AssertionResult::hasExpandedExpression(this->result);
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>(this->stream,"with expansion:\n",0x10);
    Colour::Colour(&local_a9,ReconstructedExpression);
    _stream = this->stream;
    pcVar1 = (this->result->m_resultData).reconstructedExpression._M_dataplus._M_p;
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,pcVar1,
               pcVar1 + (this->result->m_resultData).reconstructedExpression._M_string_length);
    local_30.initialIndent = 0xffffffffffffffff;
    local_30.width = 0x4f;
    local_30.tabChar = '\t';
    local_30.indent = 2;
    Text::Text(&local_88,&local_a8,&local_30);
    operator<<(_stream,&local_88);
    std::__ostream_insert<char,std::char_traits<char>>(_stream,"\n",1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_88.lines);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.str._M_dataplus._M_p != &local_88.str.field_2) {
      operator_delete(local_88.str._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    Colour::~Colour(&local_a9);
  }
  return;
}

Assistant:

void printReconstructedExpression() const {
                if( result.hasExpandedExpression() ) {
                    stream << "with expansion:\n";
                    Colour colourGuard( Colour::ReconstructedExpression );
                    stream << Text( result.getExpandedExpression(), TextAttributes().setIndent(2) ) << "\n";
                }
            }